

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O1

void __thiscall I2cAnalyzer::~I2cAnalyzer(I2cAnalyzer *this)

{
  pointer puVar1;
  I2cAnalyzerResults *pIVar2;
  I2cAnalyzerSettings *pIVar3;
  
  *(undefined ***)this = &PTR__I2cAnalyzer_0010bca0;
  Analyzer::KillThread();
  puVar1 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  I2cSimulationDataGenerator::~I2cSimulationDataGenerator(&this->mSimulationDataGenerator);
  pIVar2 = (this->mResults)._M_ptr;
  if (pIVar2 != (I2cAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pIVar2 + 8))();
  }
  pIVar3 = (this->mSettings)._M_ptr;
  if (pIVar3 != (I2cAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pIVar3 + 8))();
  }
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

I2cAnalyzer::~I2cAnalyzer()
{
    KillThread();
}